

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O1

void plutovg_canvas_clip_extents(plutovg_canvas_t *canvas,plutovg_rect_t *extents)

{
  if (canvas->state->clipping == true) {
    plutovg_span_buffer_extents(&canvas->state->clip_spans,extents);
    return;
  }
  extents->x = (canvas->clip_rect).x;
  extents->y = (canvas->clip_rect).y;
  extents->w = (canvas->clip_rect).w;
  extents->h = (canvas->clip_rect).h;
  return;
}

Assistant:

void plutovg_canvas_clip_extents(const plutovg_canvas_t* canvas, plutovg_rect_t* extents)
{
    if(canvas->state->clipping) {
        plutovg_span_buffer_extents(&canvas->state->clip_spans, extents);
    } else {
        extents->x = canvas->clip_rect.x;
        extents->y = canvas->clip_rect.y;
        extents->w = canvas->clip_rect.w;
        extents->h = canvas->clip_rect.h;
    }
}